

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

bool __thiscall duckdb::RowGroupCollection::IsPersistent(RowGroupCollection *this)

{
  bool bVar1;
  RowGroup *row_group;
  RowGroup *this_00;
  SegmentIterator __begin1;
  SegmentIterator local_28;
  SegmentIterationHelper local_18;
  
  local_18.tree =
       &shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups)->
        super_SegmentTree<duckdb::RowGroup,_true>;
  local_28 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::begin(&local_18);
  this_00 = local_28.current;
  while (this_00 != (RowGroup *)0x0) {
    bVar1 = RowGroup::IsPersistent(this_00);
    if (!bVar1) break;
    SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::Next(&local_28);
    this_00 = local_28.current;
  }
  return this_00 == (RowGroup *)0x0;
}

Assistant:

bool RowGroupCollection::IsPersistent() const {
	for (auto &row_group : row_groups->Segments()) {
		if (!row_group.IsPersistent()) {
			return false;
		}
	}
	return true;
}